

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaPSVIIDCKeyPtr **pppxVar1;
  xmlSchemaIDCAugPtr pxVar2;
  xmlSchemaIDCMatcherPtr pxVar3;
  xmlSchemaIDCMatcherPtr pxVar4;
  void *pvVar5;
  xmlSchemaPSVIIDCNodePtr pxVar6;
  xmlSchemaPSVIIDCKeyPtr pxVar7;
  xmlSchemaValPtr value;
  xmlSchemaItemListPtr pxVar8;
  xmlDictPtr pxVar9;
  xmlSchemaIDCAugPtr_conflict pxVar10;
  long lVar11;
  xmlSchemaIDCMatcherPtr_conflict pxVar12;
  
  if ((vctxt->xsiAssemble != 0) && (vctxt->schema != (xmlSchemaPtr)0x0)) {
    xmlSchemaFree(vctxt->schema);
    vctxt->schema = (xmlSchemaPtr)0x0;
  }
  if (vctxt != (xmlSchemaValidCtxtPtr)0x0) {
    vctxt->flags = 0;
    vctxt->validationRoot = (xmlNodePtr)0x0;
    vctxt->doc = (xmlDocPtr)0x0;
    vctxt->reader = (xmlTextReaderPtr)0x0;
    vctxt->hasKeyrefs = 0;
    if (vctxt->value != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(vctxt->value);
      vctxt->value = (xmlSchemaValPtr)0x0;
    }
    pxVar10 = vctxt->aidcs;
    if (pxVar10 != (xmlSchemaIDCAugPtr_conflict)0x0) {
      do {
        pxVar2 = pxVar10->next;
        (*xmlFree)(pxVar10);
        pxVar10 = pxVar2;
      } while (pxVar2 != (xmlSchemaIDCAugPtr)0x0);
      vctxt->aidcs = (xmlSchemaIDCAugPtr_conflict)0x0;
    }
    pxVar12 = vctxt->idcMatcherCache;
    if (pxVar12 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
      do {
        pxVar3 = pxVar12->nextCached;
        do {
          pxVar4 = pxVar12->next;
          if (pxVar12->keySeqs != (xmlSchemaPSVIIDCKeyPtr **)0x0) {
            if (0 < pxVar12->sizeKeySeqs) {
              lVar11 = 0;
              do {
                if (pxVar12->keySeqs[lVar11] != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                  (*xmlFree)(pxVar12->keySeqs[lVar11]);
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < pxVar12->sizeKeySeqs);
            }
            (*xmlFree)(pxVar12->keySeqs);
          }
          pxVar8 = pxVar12->targets;
          if (pxVar8 != (xmlSchemaItemListPtr)0x0) {
            if ((pxVar12->idcType == 0x18) && (0 < pxVar8->nbItems)) {
              lVar11 = 0;
              do {
                pvVar5 = pxVar8->items[lVar11];
                (*xmlFree)(*(void **)((long)pvVar5 + 8));
                (*xmlFree)(pvVar5);
                lVar11 = lVar11 + 1;
                pxVar8 = pxVar12->targets;
              } while (lVar11 < pxVar8->nbItems);
            }
            pxVar8 = pxVar12->targets;
            if (pxVar8 != (xmlSchemaItemListPtr)0x0) {
              if (pxVar8->items != (void **)0x0) {
                (*xmlFree)(pxVar8->items);
              }
              (*xmlFree)(pxVar8);
            }
          }
          if (pxVar12->htab != (xmlHashTablePtr)0x0) {
            xmlHashFree(pxVar12->htab,xmlFreeIDCHashEntry);
          }
          (*xmlFree)(pxVar12);
          pxVar12 = pxVar4;
        } while (pxVar4 != (xmlSchemaIDCMatcherPtr)0x0);
        pxVar12 = pxVar3;
      } while (pxVar3 != (xmlSchemaIDCMatcherPtr)0x0);
      vctxt->idcMatcherCache = (xmlSchemaIDCMatcherPtr_conflict)0x0;
    }
    if (vctxt->idcNodes != (xmlSchemaPSVIIDCNodePtr *)0x0) {
      if (0 < vctxt->nbIdcNodes) {
        lVar11 = 0;
        do {
          pxVar6 = vctxt->idcNodes[lVar11];
          (*xmlFree)(pxVar6->keys);
          (*xmlFree)(pxVar6);
          lVar11 = lVar11 + 1;
        } while (lVar11 < vctxt->nbIdcNodes);
      }
      (*xmlFree)(vctxt->idcNodes);
      vctxt->idcNodes = (xmlSchemaPSVIIDCNodePtr *)0x0;
      vctxt->nbIdcNodes = 0;
      vctxt->sizeIdcNodes = 0;
    }
    if (vctxt->idcKeys != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
      pppxVar1 = &vctxt->idcKeys;
      if (0 < vctxt->nbIdcKeys) {
        lVar11 = 0;
        do {
          pxVar7 = (*pppxVar1)[lVar11];
          value = pxVar7->val;
          if (value != (xmlSchemaValPtr)0x0) {
            xmlSchemaFreeValue(value);
          }
          (*xmlFree)(pxVar7);
          lVar11 = lVar11 + 1;
        } while (lVar11 < vctxt->nbIdcKeys);
      }
      (*xmlFree)(*pppxVar1);
      *pppxVar1 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
      vctxt->nbIdcKeys = 0;
      vctxt->sizeIdcKeys = 0;
    }
    if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
      xmlSchemaFreeIDCStateObjList(vctxt->xpathStates);
      vctxt->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)0x0;
    }
    if (vctxt->nbAttrInfos != 0) {
      xmlSchemaClearAttrInfos(vctxt);
    }
    if ((vctxt->elemInfos != (xmlSchemaNodeInfoPtr *)0x0) && (0 < vctxt->sizeElemInfos)) {
      lVar11 = 0;
      do {
        if (vctxt->elemInfos[lVar11] == (xmlSchemaNodeInfoPtr)0x0) break;
        xmlSchemaClearElemInfo(vctxt,vctxt->elemInfos[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 < vctxt->sizeElemInfos);
    }
    pxVar8 = vctxt->nodeQNames;
    if (pxVar8->items != (void **)0x0) {
      (*xmlFree)(pxVar8->items);
      pxVar8->items = (void **)0x0;
    }
    pxVar8->nbItems = 0;
    pxVar8->sizeItems = 0;
    xmlDictFree(vctxt->dict);
    pxVar9 = xmlDictCreate();
    vctxt->dict = pxVar9;
    if (vctxt->filename != (char *)0x0) {
      (*xmlFree)(vctxt->filename);
      vctxt->filename = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void
xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt) {
    if (vctxt->xsiAssemble) {
	if (vctxt->schema != NULL) {
	    xmlSchemaFree(vctxt->schema);
	    vctxt->schema = NULL;
	}
    }
    xmlSchemaClearValidCtxt(vctxt);
}